

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  float fVar1;
  ImGuiWindow *window;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImVec2 IVar4;
  ImVec2 pos;
  ImGuiWindow *moving_window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffe8;
  
  pIVar2 = GImGui;
  if (GImGui->MovingWindow == (ImGuiWindow *)0x0) {
    if (((GImGui->ActiveIdWindow != (ImGuiWindow *)0x0) &&
        (GImGui->ActiveIdWindow->MoveId == GImGui->ActiveId)) &&
       (KeepAliveID(GImGui->ActiveId), ((pIVar2->IO).MouseDown[0] & 1U) == 0)) {
      ClearActiveID();
    }
  }
  else {
    KeepAliveID(GImGui->ActiveId);
    window = pIVar2->MovingWindow->RootWindow;
    if ((((pIVar2->IO).MouseDown[0] & 1U) == 0) ||
       (bVar3 = IsMousePosValid(&(pIVar2->IO).MousePos), !bVar3)) {
      ClearActiveID();
      pIVar2->MovingWindow = (ImGuiWindow *)0x0;
    }
    else {
      IVar4 = operator-(in_stack_ffffffffffffffe8,(ImVec2 *)0x12e586);
      fVar1 = (window->Pos).x;
      if (((fVar1 != IVar4.x) || (NAN(fVar1) || NAN(IVar4.x))) ||
         ((fVar1 = (window->Pos).y, fVar1 != IVar4.y || (NAN(fVar1) || NAN(IVar4.y))))) {
        MarkIniSettingsDirty(window);
        SetWindowPos((ImGuiWindow *)g,(ImVec2 *)moving_window,(ImGuiCond)pos.y);
      }
      FocusWindow((ImGuiWindow *)g);
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}